

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundostack.cpp
# Opt level: O2

QAction * __thiscall QUndoStack::createUndoAction(QUndoStack *this,QObject *parent,QString *prefix)

{
  char16_t *pcVar1;
  qsizetype qVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  Data *pDVar5;
  bool b;
  Data *this_00;
  long lVar6;
  undefined4 *puVar7;
  long in_FS_OFFSET;
  uint in_stack_fffffffffffffeec;
  Data *local_f8;
  Connection local_e0 [8];
  QArrayDataPointer<char16_t> local_d8;
  long lStack_c0;
  Data *local_b8;
  char16_t *pcStack_b0;
  long local_a8;
  Connection local_98 [8];
  Connection local_90 [8];
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_68;
  code *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (Data *)operator_new(0x10);
  QAction::QAction((QAction *)this_00,parent);
  if (*(long *)(*(long *)&this->field_0x8 + 0xa0) == 0) {
    b = 0 < *(int *)(*(long *)&this->field_0x8 + 0xa8);
  }
  else {
    b = false;
  }
  QAction::setEnabled((QAction *)this_00,b);
  local_68.d = (prefix->d).d;
  local_68.ptr = (prefix->d).ptr;
  local_68.size = (prefix->d).size;
  lVar6 = local_68.size;
  if (local_68.d != (Data *)0x0) {
    LOCK();
    ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    lVar6 = (prefix->d).size;
  }
  local_88.d = (Data *)0x0;
  local_88.ptr = (char16_t *)0x0;
  local_88.size = 0;
  if (lVar6 == 0) {
    tr((QString *)&local_d8,"Undo %1",(char *)0x0,-1);
    qVar4 = local_68.size;
    pcVar3 = local_68.ptr;
    pDVar5 = local_68.d;
    local_68.d = local_d8.d;
    local_68.ptr = local_d8.ptr;
    local_d8.d = pDVar5;
    local_d8.ptr = pcVar3;
    local_68.size = local_d8.size;
    local_d8.size = qVar4;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
    tr((QString *)&local_d8,"Undo","Default text for undo action",-1);
    local_88.ptr = local_d8.ptr;
    local_88.d = local_d8.d;
    local_d8.d = (Data *)0x0;
    local_d8.ptr = (char16_t *)0x0;
    local_88.size = local_d8.size;
    local_d8.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
  }
  undoText((QString *)&local_d8,this);
  QUndoStackPrivate::setPrefixedText
            ((QAction *)this_00,(QString *)&local_68,(QString *)&local_88,(QString *)&local_d8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
  local_d8.d = (Data *)QAction::setEnabled;
  local_d8.ptr = (char16_t *)0x0;
  QObject::connect<void(QUndoStack::*)(bool),void(QAction::*)(bool)>
            ((Object *)local_90,(offset_in_QUndoStack_to_subr)this,(ContextType *)canUndoChanged,
             (offset_in_QAction_to_subr *)0x0,(ConnectionType)this_00);
  QMetaObject::Connection::~Connection(local_90);
  qVar4 = local_88.size;
  pcVar3 = local_88.ptr;
  local_d8.ptr = (char16_t *)local_68.d;
  local_d8.size = (qsizetype)local_68.ptr;
  lStack_c0 = local_68.size;
  if (local_68.d != (Data *)0x0) {
    LOCK();
    ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_b8 = local_88.d;
  pcStack_b0 = local_88.ptr;
  local_a8 = local_88.size;
  if (local_88.d == (Data *)0x0) {
    local_f8 = (Data *)0x0;
  }
  else {
    LOCK();
    ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_f8 = local_88.d;
  }
  local_48 = undoTextChanged;
  local_40 = 0;
  local_d8.d = this_00;
  puVar7 = (undefined4 *)operator_new(0x48);
  lVar6 = lStack_c0;
  qVar2 = local_d8.size;
  pcVar1 = local_d8.ptr;
  *puVar7 = 1;
  local_d8.ptr = (char16_t *)0x0;
  *(code **)(puVar7 + 2) =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/util/qundostack.cpp:1051:57),_QtPrivate::List<const_QString_&>,_void>
       ::impl;
  *(Data **)(puVar7 + 4) = local_d8.d;
  *(char16_t **)(puVar7 + 6) = pcVar1;
  local_d8.size = 0;
  *(qsizetype *)(puVar7 + 8) = qVar2;
  lStack_c0 = 0;
  *(long *)(puVar7 + 10) = lVar6;
  local_b8 = (Data *)0x0;
  pcStack_b0 = (char16_t *)0x0;
  *(Data **)(puVar7 + 0xc) = local_f8;
  *(char16_t **)(puVar7 + 0xe) = pcVar3;
  local_a8 = 0;
  *(qsizetype *)(puVar7 + 0x10) = qVar4;
  QObject::connectImpl
            ((QObject *)local_98,(void **)this,(QObject *)&local_48,(void **)this_00,
             (QSlotObjectBase *)0x0,(ConnectionType)puVar7,
             (int *)((ulong)in_stack_fffffffffffffeec << 0x20),(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection(local_98);
  createUndoAction(QObject*,QString_const&)::~__0
            ((createUndoAction_QObject__QString_const__ *)&local_d8);
  local_d8.d = (Data *)undo;
  local_d8.ptr = (char16_t *)0x0;
  QObject::connect<void(QAction::*)(bool),void(QUndoStack::*)()>
            ((Object *)local_e0,(offset_in_QAction_to_subr)this_00,(ContextType *)QAction::triggered
             ,(offset_in_QUndoStack_to_subr *)0x0,(ConnectionType)this);
  QMetaObject::Connection::~Connection(local_e0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QAction *)this_00;
}

Assistant:

QAction *QUndoStack::createUndoAction(QObject *parent, const QString &prefix) const
{
    QAction *action = new QAction(parent);
    action->setEnabled(canUndo());

    QString effectivePrefix = prefix;
    QString defaultText;
    if (prefix.isEmpty()) {
        effectivePrefix = tr("Undo %1");
        defaultText = tr("Undo", "Default text for undo action");
    }

    QUndoStackPrivate::setPrefixedText(action, effectivePrefix, defaultText, undoText());

    connect(this, &QUndoStack::canUndoChanged, action, &QAction::setEnabled);
    connect(this, &QUndoStack::undoTextChanged, action, [=](const QString &text) {
        QUndoStackPrivate::setPrefixedText(action, effectivePrefix, defaultText, text);
    });
    connect(action, &QAction::triggered, this, &QUndoStack::undo);

    return action;
}